

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O1

void p_socket_set_keepalive(PSocket *socket,pboolean keepalive)

{
  undefined4 in_EAX;
  int iVar1;
  ulong uStack_18;
  pint value;
  
  if ((socket != (PSocket *)0x0) && (((socket->field_0x18 & 2) == 0) == (keepalive != 0))) {
    uStack_18 = (ulong)CONCAT14(keepalive != 0,in_EAX);
    iVar1 = setsockopt(socket->fd,1,9,&value,4);
    if (iVar1 < 0) {
      printf("** Warning: %s **\n",
             "PSocket::p_socket_set_keepalive: setsockopt() with SO_KEEPALIVE failed");
    }
    else {
      socket->field_0x18 = socket->field_0x18 & 0xfd | (keepalive != 0) * '\x02';
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_socket_set_keepalive (PSocket		*socket,
			pboolean	keepalive)
{
#ifdef P_OS_WIN
	pchar value;
#else
	pint value;
#endif

	if (P_UNLIKELY (socket == NULL))
		return;

	if (socket->keepalive == (puint) !!keepalive)
		return;

#ifdef P_OS_WIN
	value = !! (pchar) keepalive;
#else
	value = !! (pint) keepalive;
#endif
	if (setsockopt (socket->fd, SOL_SOCKET, SO_KEEPALIVE, &value, sizeof (value)) < 0) {
		P_WARNING ("PSocket::p_socket_set_keepalive: setsockopt() with SO_KEEPALIVE failed");
		return;
	}

	socket->keepalive = !! (pint) keepalive;
}